

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStrQEqual(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_44;
  int n_str;
  xmlChar *str;
  int n_name;
  xmlChar *name;
  int n_pref;
  xmlChar *pref;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
    for (str._4_4_ = 0; (int)str._4_4_ < 5; str._4_4_ = str._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_const_xmlChar_ptr(name._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(str._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        iVar2 = xmlStrQEqual(val,val_00,val_01);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(name._4_4_,val,0);
        des_const_xmlChar_ptr(str._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrQEqual",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)str._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlStrQEqual(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    const xmlChar * pref; /* the prefix of the QName */
    int n_pref;
    const xmlChar * name; /* the localname of the QName */
    int n_name;
    const xmlChar * str; /* the second xmlChar * */
    int n_str;

    for (n_pref = 0;n_pref < gen_nb_const_xmlChar_ptr;n_pref++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
        mem_base = xmlMemBlocks();
        pref = gen_const_xmlChar_ptr(n_pref, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        str = gen_const_xmlChar_ptr(n_str, 2);

        ret_val = xmlStrQEqual(pref, name, str);
        desret_int(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_pref, pref, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_str, str, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStrQEqual",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_pref);
            printf(" %d", n_name);
            printf(" %d", n_str);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}